

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrix.h
# Opt level: O2

void __thiscall
Eigen::TriangularBase<Eigen::TriangularView<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1u>>::
evalToLazy<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (TriangularBase<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>> *this,
          MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other)

{
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)other,
             *(Index *)(*(long *)this + 8),*(Index *)(*(long *)this + 0x10));
  internal::
  triangular_assignment_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1U,_-1,_true>
  ::run((Matrix<double,__1,__1,_0,__1,__1> *)other,*(Matrix<double,__1,__1,_0,__1,__1> **)this);
  return;
}

Assistant:

void TriangularBase<Derived>::evalToLazy(MatrixBase<DenseDerived> &other) const
{
  enum {
    unroll = DenseDerived::SizeAtCompileTime != Dynamic
                   && internal::traits<Derived>::CoeffReadCost != Dynamic
                   && DenseDerived::SizeAtCompileTime * internal::traits<Derived>::CoeffReadCost / 2
                        <= EIGEN_UNROLLING_LIMIT
  };
  other.derived().resize(this->rows(), this->cols());

  internal::triangular_assignment_selector
    <DenseDerived, typename internal::traits<Derived>::MatrixTypeNestedCleaned, Derived::Mode,
    unroll ? int(DenseDerived::SizeAtCompileTime) : Dynamic,
    true // clear the opposite triangular part
    >::run(other.derived(), derived().nestedExpression());
}